

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenType BinaryenTypeCreate(BinaryenType *types,BinaryenIndex numTypes)

{
  Type TVar1;
  ulong uVar2;
  undefined1 auStack_58 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> typeVec;
  Type local_38;
  
  auStack_58 = (undefined1  [8])0x0;
  typeVec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  typeVec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::reserve
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58,(ulong)numTypes);
  if (numTypes != 0) {
    uVar2 = 0;
    do {
      local_38.id = types[uVar2];
      if (typeVec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start ==
          typeVec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58,
                   (iterator)
                   typeVec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                   super__Vector_impl_data._M_start,&local_38);
      }
      else {
        (typeVec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_start)->id = (uintptr_t)local_38;
        typeVec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start =
             typeVec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      uVar2 = uVar2 + 1;
    } while (numTypes != uVar2);
  }
  wasm::Type::Type(&local_38,(Tuple *)auStack_58);
  TVar1.id = local_38.id;
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58,
                    (long)typeVec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
  }
  return TVar1.id;
}

Assistant:

BinaryenType BinaryenTypeCreate(BinaryenType* types, BinaryenIndex numTypes) {
  std::vector<Type> typeVec;
  typeVec.reserve(numTypes);
  for (BinaryenIndex i = 0; i < numTypes; ++i) {
    typeVec.push_back(Type(types[i]));
  }
  return Type(typeVec).getID();
}